

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O0

int parse_register_name(Context_conflict2 *ctx,RegisterType *rtype,int *rnum)

{
  Token TVar1;
  int iVar2;
  uint32 local_3c;
  RegisterType local_38;
  uint32 ui32;
  int tlen;
  RegisterType regtype;
  int regnum;
  int neednum;
  int *rnum_local;
  RegisterType *rtype_local;
  Context_conflict2 *ctx_local;
  
  _regnum = rnum;
  rnum_local = (int *)rtype;
  rtype_local = (RegisterType *)ctx;
  TVar1 = nexttoken(ctx);
  if (TVar1 == TOKEN_IDENTIFIER) {
    regtype = REG_TYPE_INPUT;
    tlen = 0;
    ui32 = 0;
    iVar2 = check_token_segment((Context_conflict2 *)rtype_local,"oDepth");
    if (iVar2 == 0) {
      iVar2 = check_token_segment((Context_conflict2 *)rtype_local,"vFace");
      if (iVar2 == 0) {
        iVar2 = check_token_segment((Context_conflict2 *)rtype_local,"vPos");
        if (iVar2 == 0) {
          iVar2 = check_token_segment((Context_conflict2 *)rtype_local,"oPos");
          if (iVar2 == 0) {
            iVar2 = check_token_segment((Context_conflict2 *)rtype_local,"oFog");
            if (iVar2 == 0) {
              iVar2 = check_token_segment((Context_conflict2 *)rtype_local,"oPts");
              if (iVar2 == 0) {
                iVar2 = check_token_segment((Context_conflict2 *)rtype_local,"aL");
                if (iVar2 == 0) {
                  iVar2 = check_token_segment((Context_conflict2 *)rtype_local,"oC");
                  if (iVar2 == 0) {
                    iVar2 = check_token_segment((Context_conflict2 *)rtype_local,"oT");
                    if (iVar2 == 0) {
                      iVar2 = check_token_segment((Context_conflict2 *)rtype_local,"oD");
                      if (iVar2 == 0) {
                        iVar2 = check_token_segment((Context_conflict2 *)rtype_local,"r");
                        if (iVar2 == 0) {
                          iVar2 = check_token_segment((Context_conflict2 *)rtype_local,"v");
                          if (iVar2 == 0) {
                            iVar2 = check_token_segment((Context_conflict2 *)rtype_local,"c");
                            if (iVar2 == 0) {
                              iVar2 = check_token_segment((Context_conflict2 *)rtype_local,"i");
                              if (iVar2 == 0) {
                                iVar2 = check_token_segment((Context_conflict2 *)rtype_local,"b");
                                if (iVar2 == 0) {
                                  iVar2 = check_token_segment((Context_conflict2 *)rtype_local,"s");
                                  if (iVar2 == 0) {
                                    iVar2 = check_token_segment((Context_conflict2 *)rtype_local,"l"
                                                               );
                                    if (iVar2 == 0) {
                                      iVar2 = check_token_segment((Context_conflict2 *)rtype_local,
                                                                  "p");
                                      if (iVar2 == 0) {
                                        iVar2 = check_token_segment((Context_conflict2 *)rtype_local
                                                                    ,"o");
                                        if (iVar2 == 0) {
                                          iVar2 = check_token_segment((Context_conflict2 *)
                                                                      rtype_local,"a");
                                          if (iVar2 == 0) {
                                            iVar2 = check_token_segment((Context_conflict2 *)
                                                                        rtype_local,"t");
                                            if (iVar2 == 0) {
                                              fail((Context_conflict2 *)rtype_local,
                                                   "expected register type");
                                              ui32 = 2;
                                              tlen = 0;
                                              regtype = REG_TYPE_TEMP;
                                            }
                                            else {
                                              ui32 = 3;
                                            }
                                          }
                                          else {
                                            ui32 = 3;
                                          }
                                        }
                                        else {
                                          ui32 = 6;
                                        }
                                      }
                                      else {
                                        ui32 = 0x13;
                                      }
                                    }
                                    else {
                                      ui32 = 0x12;
                                    }
                                  }
                                  else {
                                    ui32 = 10;
                                  }
                                }
                                else {
                                  ui32 = 0xe;
                                }
                              }
                              else {
                                ui32 = 7;
                              }
                            }
                            else {
                              ui32 = 2;
                            }
                          }
                          else {
                            ui32 = 1;
                          }
                        }
                        else {
                          ui32 = 0;
                        }
                      }
                      else {
                        ui32 = 5;
                      }
                    }
                    else {
                      ui32 = 6;
                    }
                  }
                  else {
                    ui32 = 8;
                  }
                }
                else {
                  ui32 = 0xf;
                  regtype = REG_TYPE_TEMP;
                }
              }
              else {
                ui32 = 4;
                tlen = 2;
                regtype = REG_TYPE_TEMP;
              }
            }
            else {
              ui32 = 4;
              tlen = 1;
              regtype = REG_TYPE_TEMP;
            }
          }
          else {
            ui32 = 4;
            tlen = 0;
            regtype = REG_TYPE_TEMP;
          }
        }
        else {
          ui32 = 0x11;
          tlen = 0;
          regtype = REG_TYPE_TEMP;
        }
      }
      else {
        ui32 = 0x11;
        tlen = 1;
        regtype = REG_TYPE_TEMP;
      }
    }
    else {
      ui32 = 9;
      regtype = REG_TYPE_TEMP;
    }
    if ((regtype != REG_TYPE_TEMP) && (rtype_local[0x16] == REG_TYPE_TEMP)) {
      local_38 = rtype_local[0x16];
      TVar1 = nexttoken((Context_conflict2 *)rtype_local);
      if (TVar1 == 0x5b) {
        regtype = REG_TYPE_TEMP;
      }
      pushback((Context_conflict2 *)rtype_local);
      rtype_local[0x16] = local_38;
    }
    if (regtype != REG_TYPE_TEMP) {
      local_3c = 0;
      iVar2 = ui32fromtoken((Context_conflict2 *)rtype_local,&local_3c);
      if (iVar2 == 0) {
        fail((Context_conflict2 *)rtype_local,"Invalid register index");
      }
      tlen = local_3c;
    }
    if (ui32 == 2) {
      if (tlen < 0x800) {
        ui32 = 2;
      }
      else if (tlen < 0x1000) {
        ui32 = 0xb;
        tlen = tlen + -0x800;
      }
      else if (tlen < 0x1800) {
        ui32 = 0xc;
        tlen = tlen + -0x1000;
      }
      else if (tlen < 0x2000) {
        ui32 = 0xd;
        tlen = tlen + -0x1800;
      }
      else {
        fail((Context_conflict2 *)rtype_local,"Invalid const register index");
      }
    }
    *rnum_local = ui32;
    *_regnum = tlen;
    ctx_local._4_4_ = 1;
  }
  else {
    fail((Context_conflict2 *)rtype_local,"Expected register");
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int parse_register_name(Context *ctx, RegisterType *rtype, int *rnum)
{
    if (nexttoken(ctx) != TOKEN_IDENTIFIER)
    {
        fail(ctx, "Expected register");
        return 0;
    } // if

    int neednum = 1;
    int regnum = 0;
    RegisterType regtype = REG_TYPE_TEMP;

    // Watch out for substrings! oDepth must be checked before oD, since
    //  the latter will match either case.
    if (check_token_segment(ctx, "oDepth"))
    {
        regtype = REG_TYPE_DEPTHOUT;
        neednum = 0;
    } // else if
    else if (check_token_segment(ctx, "vFace"))
    {
        regtype = REG_TYPE_MISCTYPE;
        regnum = (int) MISCTYPE_TYPE_FACE;
        neednum = 0;
    } // else if
    else if (check_token_segment(ctx, "vPos"))
    {
        regtype = REG_TYPE_MISCTYPE;
        regnum = (int) MISCTYPE_TYPE_POSITION;
        neednum = 0;
    } // else if
    else if (check_token_segment(ctx, "oPos"))
    {
        regtype = REG_TYPE_RASTOUT;
        regnum = (int) RASTOUT_TYPE_POSITION;
        neednum = 0;
    } // else if
    else if (check_token_segment(ctx, "oFog"))
    {
        regtype = REG_TYPE_RASTOUT;
        regnum = (int) RASTOUT_TYPE_FOG;
        neednum = 0;
    } // else if
    else if (check_token_segment(ctx, "oPts"))
    {
        regtype = REG_TYPE_RASTOUT;
        regnum = (int) RASTOUT_TYPE_POINT_SIZE;
        neednum = 0;
    } // else if
    else if (check_token_segment(ctx, "aL"))
    {
        regtype = REG_TYPE_LOOP;
        neednum = 0;
    } // else if
    else if (check_token_segment(ctx, "oC"))
        regtype = REG_TYPE_COLOROUT;
    else if (check_token_segment(ctx, "oT"))
        regtype = REG_TYPE_OUTPUT;
    else if (check_token_segment(ctx, "oD"))
        regtype = REG_TYPE_ATTROUT;
    else if (check_token_segment(ctx, "r"))
        regtype = REG_TYPE_TEMP;
    else if (check_token_segment(ctx, "v"))
        regtype = REG_TYPE_INPUT;
    else if (check_token_segment(ctx, "c"))
        regtype = REG_TYPE_CONST;
    else if (check_token_segment(ctx, "i"))
        regtype = REG_TYPE_CONSTINT;
    else if (check_token_segment(ctx, "b"))
        regtype = REG_TYPE_CONSTBOOL;
    else if (check_token_segment(ctx, "s"))
        regtype = REG_TYPE_SAMPLER;
    else if (check_token_segment(ctx, "l"))
        regtype = REG_TYPE_LABEL;
    else if (check_token_segment(ctx, "p"))
        regtype = REG_TYPE_PREDICATE;
    else if (check_token_segment(ctx, "o"))
        regtype = REG_TYPE_OUTPUT;
    else if (check_token_segment(ctx, "a"))
        regtype = REG_TYPE_ADDRESS;
    else if (check_token_segment(ctx, "t"))
        regtype = REG_TYPE_ADDRESS;
        
    //case REG_TYPE_TEMPFLOAT16:  // !!! FIXME: don't know this asm string

    else
    {
        fail(ctx, "expected register type");
        regtype = REG_TYPE_CONST;
        regnum = 0;
        neednum = 0;
    } // else

    // "c[5]" is the same as "c5", so if the token is done, see if next is '['.
    if ((neednum) && (ctx->tokenlen == 0))
    {
        const int tlen = ctx->tokenlen;  // we need to protect this for later.
        if (nexttoken(ctx) == ((Token) '['))
            neednum = 0;  // don't need a number on register name itself.
        pushback(ctx);
        ctx->tokenlen = tlen;
    } // if

    if (neednum)
    {
        uint32 ui32 = 0;
        if (!ui32fromtoken(ctx, &ui32))
            fail(ctx, "Invalid register index");
        regnum = (int) ui32;
    } // if

    // split up REG_TYPE_CONST
    if (regtype == REG_TYPE_CONST)
    {
        if (regnum < 2048)
        {
            regtype = REG_TYPE_CONST;
            regnum -= 0;
        } // if
        else if (regnum < 4096)
        {
            regtype = REG_TYPE_CONST2;
            regnum -= 2048;
        } // if
        else if (regnum < 6144)
        {
            regtype = REG_TYPE_CONST3;
            regnum -= 4096;
        } // if
        else if (regnum < 8192)
        {
            regtype = REG_TYPE_CONST4;
            regnum -= 6144;
        } // if
        else
        {
            fail(ctx, "Invalid const register index");
        } // else
    } // if

    *rtype = regtype;
    *rnum = regnum;

    return 1;
}